

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestrm.cpp
# Opt level: O1

int32_t T_FileStream_size(FileStream *fileStream)

{
  long lVar1;
  long lVar2;
  
  lVar1 = ftell((FILE *)fileStream);
  fseek((FILE *)fileStream,0,2);
  lVar2 = ftell((FILE *)fileStream);
  fseek((FILE *)fileStream,(long)(int)lVar1,0);
  return (int32_t)lVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
T_FileStream_size(FileStream* fileStream)
{
    int32_t savedPos = ftell((FILE*)fileStream);
    int32_t size = 0;

    /*Changes by Bertrand A. D. doesn't affect the current position
    goes to the end of the file before ftell*/
    fseek((FILE*)fileStream, 0, SEEK_END);
    size = (int32_t)ftell((FILE*)fileStream);
    fseek((FILE*)fileStream, savedPos, SEEK_SET);
    return size;
}